

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_operator_expression.cpp
# Opt level: O3

LogicalType * __thiscall
duckdb::ExpressionBinder::ResolveOperatorType
          (LogicalType *__return_storage_ptr__,ExpressionBinder *this,OperatorExpression *op,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *children)

{
  ExpressionType EVar1;
  bool bVar2;
  reference pvVar3;
  type expr;
  pointer pEVar4;
  ParameterNotResolvedException *this_00;
  InternalException *this_01;
  string local_58;
  LogicalType local_38;
  
  EVar1 = (op->super_ParsedExpression).super_BaseExpression.type;
  if (EVar1 < COMPARE_IN) {
    if (1 < EVar1 - 0xe) {
      if (EVar1 == OPERATOR_NOT) {
        ResolveNotType(__return_storage_ptr__,this,(OperatorExpression *)(ulong)(EVar1 - 0xe),
                       children);
        return __return_storage_ptr__;
      }
      goto LAB_011a57d3;
    }
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](children,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    bVar2 = LogicalType::IsValid(&pEVar4->return_type);
    if (!bVar2) {
      this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_00);
      __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (1 < EVar1 - 0x23) {
      if (EVar1 == OPERATOR_COALESCE) {
        ResolveCoalesceType(__return_storage_ptr__,this,op,children);
        return __return_storage_ptr__;
      }
      if (EVar1 == OPERATOR_TRY) {
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](children,0);
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar3);
        GetExpressionReturnType(__return_storage_ptr__,expr);
        return __return_storage_ptr__;
      }
LAB_011a57d3:
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Unrecognized expression type for ResolveOperatorType","");
      InternalException::InternalException(this_01,&local_58);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ResolveCoalesceType(&local_38,this,op,children);
    LogicalType::~LogicalType(&local_38);
  }
  LogicalType::LogicalType(__return_storage_ptr__,BOOLEAN);
  return __return_storage_ptr__;
}

Assistant:

LogicalType ExpressionBinder::ResolveOperatorType(OperatorExpression &op, vector<unique_ptr<Expression>> &children) {
	switch (op.GetExpressionType()) {
	case ExpressionType::OPERATOR_IS_NULL:
	case ExpressionType::OPERATOR_IS_NOT_NULL:
		// IS (NOT) NULL always returns a boolean, and does not cast its children
		if (!children[0]->return_type.IsValid()) {
			throw ParameterNotResolvedException();
		}
		return LogicalType::BOOLEAN;
	case ExpressionType::COMPARE_IN:
	case ExpressionType::COMPARE_NOT_IN:
		ResolveCoalesceType(op, children);
		// (NOT) IN always returns a boolean
		return LogicalType::BOOLEAN;
	case ExpressionType::OPERATOR_COALESCE: {
		return ResolveCoalesceType(op, children);
	}
	case ExpressionType::OPERATOR_TRY:
		return ExpressionBinder::GetExpressionReturnType(*children[0]);
	case ExpressionType::OPERATOR_NOT:
		return ResolveNotType(op, children);
	default:
		throw InternalException("Unrecognized expression type for ResolveOperatorType");
	}
}